

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

void xmlXIncludeFreeRef(xmlXIncludeRefPtr ref)

{
  if (ref != (xmlXIncludeRefPtr)0x0) {
    if (ref->URI != (xmlChar *)0x0) {
      (*xmlFree)(ref->URI);
    }
    if (ref->fragment != (xmlChar *)0x0) {
      (*xmlFree)(ref->fragment);
    }
    if (ref->base != (xmlChar *)0x0) {
      (*xmlFree)(ref->base);
    }
    (*xmlFree)(ref);
    return;
  }
  return;
}

Assistant:

static void
xmlXIncludeFreeRef(xmlXIncludeRefPtr ref) {
    if (ref == NULL)
	return;
    if (ref->URI != NULL)
	xmlFree(ref->URI);
    if (ref->fragment != NULL)
	xmlFree(ref->fragment);
    if (ref->base != NULL)
	xmlFree(ref->base);
    xmlFree(ref);
}